

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteActions::~MADPComponentDiscreteActions(MADPComponentDiscreteActions *this)

{
  pointer puVar1;
  pointer pvVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer ppJVar5;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *this_00;
  _Base_ptr p_Var6;
  void *pvVar7;
  pointer pAVar8;
  pointer this_01;
  pointer ppJVar9;
  pointer pvVar10;
  
  this->_vptr_MADPComponentDiscreteActions =
       (_func_int **)&PTR__MADPComponentDiscreteActions_005da1b8;
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar1) {
    (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pvVar2 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (this->_m_actionVecs).
                 super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar2; pvVar10 = pvVar10 + 1
      ) {
    pAVar3 = (pvVar10->super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pAVar4 = (pvVar10->super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pAVar8 = pAVar3;
    if (pAVar4 != pAVar3) {
      do {
        (**(pAVar8->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity)(pAVar8);
        pAVar8 = pAVar8 + 1;
      } while (pAVar8 != pAVar4);
      (pvVar10->super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>)._M_impl.
      super__Vector_impl_data._M_finish = pAVar3;
    }
  }
  pvVar10 = (this->_m_actionVecs).
            super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pvVar10;
  if (pvVar2 != pvVar10) {
    do {
      std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pvVar2);
    (this->_m_actionVecs).
    super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
  }
  ppJVar5 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar9 = (this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppJVar9 != ppJVar5; ppJVar9 = ppJVar9 + 1
      ) {
    if (*ppJVar9 != (JointActionDiscrete *)0x0) {
      (*((*ppJVar9)->super_JointAction)._vptr_JointAction[1])();
    }
  }
  ppJVar9 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar9) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar9;
  }
  if (this->_m_jointActionIndices !=
      (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
       *)0x0) {
    while (this_00 = &this->_m_jointActionIndices->_M_t,
          (this_00->_M_impl).super__Rb_tree_header._M_node_count != 0) {
      p_Var6 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left[1]._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        pvVar7 = *(void **)p_Var6;
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,(long)p_Var6->_M_left - (long)pvVar7);
        }
        operator_delete(p_Var6,0x18);
      }
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                          *)this->_m_jointActionIndices,
                         *(_Base_ptr *)
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                            *)this->_m_jointActionIndices + 0x18));
    }
    if (this_00 !=
        (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
         *)0x0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
      ::~_Rb_tree(this_00);
      operator_delete(this_00,0x30);
    }
  }
  if (this->_m_actionStepSize != (size_t *)0x0) {
    operator_delete__(this->_m_actionStepSize);
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::~vector(&this->_m_actionVecs);
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->_m_nrActions).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ppJVar9 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar9 == (pointer)0x0) {
    return;
  }
  operator_delete(ppJVar9,(long)(this->_m_jointActionVec).
                                super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppJVar9);
  return;
}

Assistant:

MADPComponentDiscreteActions::~MADPComponentDiscreteActions()
{
    _m_nrActions.clear();
    vector<vector<ActionDiscrete> >::iterator it = _m_actionVecs.begin();
    vector<vector<ActionDiscrete> >::iterator last = _m_actionVecs.end();
    while(it != last)
    {
        // (*it) isa vector<ActionDiscrete>
        (*it).clear();
        it++;
    }
    _m_actionVecs.clear();
    vector<JointActionDiscrete*>::iterator it2 = _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //removes the joint action pointed to...
        it2++;
    }
    _m_jointActionVec.clear();
    if(_m_jointActionIndices)
    {
        while(!_m_jointActionIndices->empty())
        {
            delete (*_m_jointActionIndices->begin()).second;
            _m_jointActionIndices->erase( _m_jointActionIndices->begin() );
        }
        delete _m_jointActionIndices;
    }
//     if(_m_jointActionIndices)
//     {
//         vector<vector<Index>*>::iterator it3 = _m_jointActionIndices->begin();
//         vector<vector<Index>*>::iterator last3 = _m_jointActionIndices->end();
//         while(it3 != last3)
//         {
//             delete *it3;
//             it3++;
//         }
//     }

    delete[] _m_actionStepSize;
}